

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O3

void __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>_>
::clear(table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>_>
        *this)

{
  slot_type *psVar1;
  size_t sVar2;
  group_type_pointer pgVar3;
  value_type_pointer ppVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  
  if ((this->arrays).elements_ == (value_type_pointer)0x0) {
    return;
  }
  sVar2 = (this->arrays).groups_size_mask;
  pgVar3 = (this->arrays).groups_;
  if (pgVar3 == pgVar3 + sVar2 + 1) {
    pgVar3[sVar2].m[0xe].n = '\x01';
  }
  else {
    lVar6 = 0;
    do {
      psVar1 = pgVar3->m + lVar6;
      psVar1->n = '\0';
      psVar1[1] = '\0';
      psVar1[2] = '\0';
      psVar1[3] = '\0';
      psVar1[4] = '\0';
      psVar1[5] = '\0';
      psVar1[6] = '\0';
      psVar1[7] = '\0';
      psVar1[8] = '\0';
      psVar1[9] = '\0';
      psVar1[10] = '\0';
      psVar1[0xb] = '\0';
      psVar1[0xc] = '\0';
      psVar1[0xd] = '\0';
      psVar1[0xe] = '\0';
      psVar1[0xf] = '\0';
      lVar6 = lVar6 + 0x10;
    } while (sVar2 * 0x10 + 0x10 != lVar6);
    ppVar4 = (this->arrays).elements_;
    (this->arrays).groups_[(this->arrays).groups_size_mask].m[0xe].n = '\x01';
    if (ppVar4 == (value_type_pointer)0x0) {
      uVar7 = 0;
      goto LAB_001adf7f;
    }
  }
  uVar5 = (this->arrays).groups_size_mask * 0xf + 0xe;
  uVar7 = (ulong)((float)uVar5 * 0.875);
  uVar7 = (long)((float)uVar5 * 0.875 - 9.223372e+18) & (long)uVar7 >> 0x3f | uVar7;
  if (uVar5 < 0x1e) {
    uVar7 = uVar5;
  }
LAB_001adf7f:
  (this->size_ctrl).ml = uVar7;
  (this->size_ctrl).size = 0;
  return;
}

Assistant:

void clear() noexcept {
        auto p = arrays.elements();
        if (p) {
            for (auto pg = arrays.groups(), last = pg + arrays.groups_size_mask + 1; pg != last;
                 ++pg, p += N) {
                auto mask = match_really_occupied(pg, last);
                while (mask) {
                    destroy_element(p + unchecked_countr_zero(mask));
                    mask &= mask - 1;
                }
                /* we wipe the entire metadata to reset the overflow byte as well */
                pg->initialize();
            }
            arrays.groups()[arrays.groups_size_mask].set_sentinel();
            size_ctrl.ml = initial_max_load();
            size_ctrl.size = 0;
        }
    }